

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O0

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CNegativeExpression *expression)

{
  pointer pIVar1;
  CNegateConditionalWrapper *this_00;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> local_20;
  CNegativeExpression *local_18;
  CNegativeExpression *expression_local;
  CBuildVisitor *this_local;
  
  local_18 = expression;
  expression_local = (CNegativeExpression *)this;
  std::operator<<((ostream *)&std::cout,"IRT builder: CNegativeExpression\n");
  pIVar1 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                     (&local_18->expression);
  (**(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  this_00 = (CNegateConditionalWrapper *)operator_new(0x10);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::unique_ptr
            (&local_20,&this->wrapper);
  IRT::CNegateConditionalWrapper::CNegateConditionalWrapper(this_00,&local_20);
  updateSubtreeWrapper(this,(ISubtreeWrapper *)this_00);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void CBuildVisitor::Visit( CNegativeExpression &expression ) {
    std::cout << "IRT builder: CNegativeExpression\n";
    expression.expression->Accept( *this );

    updateSubtreeWrapper( new IRT::CNegateConditionalWrapper(
            std::move( wrapper )
    ));
}